

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

Optional<unsigned_int> llvm::dwarf::LanguageLowerBound(SourceLanguage Lang)

{
  ulong uVar1;
  ulong uVar2;
  
  switch(Lang) {
  case DW_LANG_C89:
  case DW_LANG_C:
  case DW_LANG_C_plus_plus:
  case DW_LANG_Java:
  case DW_LANG_C99:
  case DW_LANG_ObjC:
  case DW_LANG_ObjC_plus_plus:
  case DW_LANG_UPC:
  case DW_LANG_D:
  case DW_LANG_Python:
  case DW_LANG_OpenCL:
  case DW_LANG_Go:
  case DW_LANG_Haskell:
  case DW_LANG_C_plus_plus_03:
  case DW_LANG_C_plus_plus_11:
  case DW_LANG_OCaml:
  case DW_LANG_Rust:
  case DW_LANG_C11:
  case DW_LANG_Swift:
  case DW_LANG_Dylan:
  case DW_LANG_C_plus_plus_14:
  case DW_LANG_RenderScript:
  case DW_LANG_BLISS:
switchD_00d40e0e_caseD_1:
    uVar1 = 0x100000000;
    break;
  case DW_LANG_Ada83:
  case DW_LANG_Cobol74:
  case DW_LANG_Cobol85:
  case DW_LANG_Fortran77:
  case DW_LANG_Fortran90:
  case DW_LANG_Pascal83:
  case DW_LANG_Modula2:
  case DW_LANG_Ada95:
  case DW_LANG_Fortran95:
  case DW_LANG_PLI:
  case DW_LANG_Modula3:
  case DW_LANG_Julia:
  case DW_LANG_Fortran03:
  case DW_LANG_Fortran08:
    uVar2 = 1;
    uVar1 = 0x100000000;
    goto LAB_00d40e2d;
  default:
    if ((Lang == DW_LANG_GOOGLE_RenderScript) || (Lang == DW_LANG_BORLAND_Delphi))
    goto switchD_00d40e0e_caseD_1;
    uVar1 = 0;
  }
  uVar2 = 0;
LAB_00d40e2d:
  return (Optional<unsigned_int>)(uVar1 | uVar2);
}

Assistant:

Optional<unsigned> llvm::dwarf::LanguageLowerBound(dwarf::SourceLanguage Lang) {
  switch (Lang) {
  default:
    return None;
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  case DW_LANG_##NAME:                                                         \
    return LOWER_BOUND;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}